

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,true,false>
               (timestamp_t *ldata,timestamp_t *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  timestamp_t tVar2;
  ulong uVar3;
  int64_t *piVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  timestamp_t lentry_1;
  ulong uVar8;
  ulong uVar9;
  timestamp_t lentry;
  interval_t iVar10;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      tVar2 = (timestamp_t)ldata->value;
      piVar4 = &result_data->micros;
      iVar6 = 0;
      do {
        iVar10 = Interval::GetDifference(tVar2,(timestamp_t)rdata[iVar6].value);
        ((interval_t *)(piVar4 + -1))->months = (int)iVar10._0_8_;
        ((interval_t *)(piVar4 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
        *piVar4 = iVar10.micros;
        iVar6 = iVar6 + 1;
        piVar4 = piVar4 + 2;
      } while (count != iVar6);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar3 = 0;
    uVar9 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = 0xffffffffffffffff;
      }
      else {
        uVar7 = puVar1[uVar3];
      }
      uVar8 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar8 = count;
      }
      uVar5 = uVar8;
      if (uVar7 != 0) {
        uVar5 = uVar9;
        if (uVar7 == 0xffffffffffffffff) {
          if (uVar9 < uVar8) {
            tVar2 = (timestamp_t)ldata->value;
            piVar4 = &result_data[uVar9].micros;
            do {
              iVar10 = Interval::GetDifference(tVar2,(timestamp_t)rdata[uVar9].value);
              ((interval_t *)(piVar4 + -1))->months = (int)iVar10._0_8_;
              ((interval_t *)(piVar4 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
              *piVar4 = iVar10.micros;
              uVar9 = uVar9 + 1;
              piVar4 = piVar4 + 2;
              uVar5 = uVar9;
            } while (uVar8 != uVar9);
          }
        }
        else if (uVar9 < uVar8) {
          piVar4 = &result_data[uVar9].micros;
          uVar5 = 0;
          do {
            if ((uVar7 >> (uVar5 & 0x3f) & 1) != 0) {
              iVar10 = Interval::GetDifference
                                 ((timestamp_t)ldata->value,(timestamp_t)rdata[uVar9 + uVar5].value)
              ;
              ((interval_t *)(piVar4 + -1))->months = (int)iVar10._0_8_;
              ((interval_t *)(piVar4 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
              *piVar4 = iVar10.micros;
            }
            uVar5 = uVar5 + 1;
            piVar4 = piVar4 + 2;
          } while ((uVar9 - uVar8) + uVar5 != 0);
          uVar5 = uVar9 + uVar5;
        }
      }
      uVar3 = uVar3 + 1;
      uVar9 = uVar5;
    } while (uVar3 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}